

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_proxy_revocable(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  JSValue JVar4;
  JSValue v;
  JSValue this_obj;
  JSValueUnion local_48;
  JSValueUnion local_40;
  JSValueUnion local_38;
  
  local_40 = local_48;
  JVar4 = js_proxy_constructor(ctx,this_val,argc,argv);
  JVar2 = JVar4.u;
  if ((uint)JVar4.tag == 6) {
    v = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    _local_48 = JVar4;
    v = JS_NewCFunctionData(ctx,js_proxy_revoke,0,0,1,(JSValue *)&local_48);
    if ((int)v.tag != 6) {
      local_38 = v.u;
      this_obj = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
      if ((int)this_obj.tag != 6) {
        JS_DefinePropertyValue(ctx,this_obj,0x83,JVar4,7);
        JVar4.tag = v.tag;
        JVar4.u.ptr = local_38.ptr;
        JS_DefinePropertyValue(ctx,this_obj,0x84,JVar4,7);
        return this_obj;
      }
      v.tag = v.tag;
      v.u.ptr = local_38.ptr;
    }
  }
  JVar3 = v.u;
  if ((0xfffffff4 < (uint)JVar4.tag) &&
     (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    local_48 = JVar2;
    __JS_FreeValueRT(ctx->rt,JVar4);
  }
  local_48.float64 = JVar3.float64;
  if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2))
  {
    __JS_FreeValueRT(ctx->rt,v);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_proxy_revocable(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue proxy_obj, revoke_obj = JS_UNDEFINED, obj;

    proxy_obj = js_proxy_constructor(ctx, JS_UNDEFINED, argc, argv);
    if (JS_IsException(proxy_obj))
        goto fail;
    revoke_obj = js_proxy_revoke_constructor(ctx, proxy_obj);
    if (JS_IsException(revoke_obj))
        goto fail;
    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        goto fail;
    // XXX: exceptions?
    JS_DefinePropertyValue(ctx, obj, JS_ATOM_proxy, proxy_obj, JS_PROP_C_W_E);
    JS_DefinePropertyValue(ctx, obj, JS_ATOM_revoke, revoke_obj, JS_PROP_C_W_E);
    return obj;
 fail:
    JS_FreeValue(ctx, proxy_obj);
    JS_FreeValue(ctx, revoke_obj);
    return JS_EXCEPTION;
}